

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

void extent_interior_deregister(tsdn_t *tsdn,rtree_ctx_t *rtree_ctx,extent_t *extent)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  undefined8 uVar5;
  ulong key;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  if (((extent->field_2).e_size_esn >> 0xc) - 3 < 0xfffffffffffffffe) {
    uVar10 = 1;
    do {
      key = uVar10 * 0x1000 + ((ulong)extent->e_addr & 0xfffffffffffff000);
      uVar7 = key & 0xffffffffc0000000;
      uVar8 = (ulong)(((uint)(key >> 0x1e) & 0xf) << 4);
      puVar1 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar8);
      uVar8 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar8);
      if (uVar8 == uVar7) {
        prVar6 = (rtree_leaf_elm_t *)((ulong)((uint)(key >> 9) & 0x1ffff8) + puVar1[1]);
      }
      else if (rtree_ctx->l2_cache[0].leafkey == uVar7) {
        prVar6 = rtree_ctx->l2_cache[0].leaf;
        rtree_ctx->l2_cache[0].leafkey = uVar8;
        rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
        *puVar1 = uVar7;
        puVar1[1] = (ulong)prVar6;
        prVar6 = (rtree_leaf_elm_t *)
                 ((long)&(prVar6->le_bits).repr + (ulong)((uint)key >> 9 & 0x1ffff8));
      }
      else {
        lVar9 = 0x118;
        do {
          if (*(ulong *)((long)rtree_ctx->cache + lVar9 + -8) == uVar7) {
            uVar4 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar9);
            puVar2 = (undefined8 *)((long)rtree_ctx->cache + lVar9 + -0x18);
            uVar5 = puVar2[1];
            puVar3 = (undefined8 *)((long)rtree_ctx->cache + lVar9 + -8);
            *puVar3 = *puVar2;
            puVar3[1] = uVar5;
            *(ulong *)((long)rtree_ctx->cache + lVar9 + -0x18) = uVar8;
            *(ulong *)((long)(rtree_ctx->cache + -1) + lVar9) = puVar1[1];
            *puVar1 = uVar7;
            puVar1[1] = uVar4;
            prVar6 = (rtree_leaf_elm_t *)(((uint)key >> 9 & 0x1ffff8) + uVar4);
            goto LAB_0012e565;
          }
          lVar9 = lVar9 + 0x10;
        } while (lVar9 != 0x188);
        prVar6 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,rtree_ctx,key,true,false);
      }
LAB_0012e565:
      (prVar6->le_bits).repr = (void *)0xe8000000000000;
      uVar10 = uVar10 + 1;
    } while (uVar10 < ((extent->field_2).e_size_esn >> 0xc) - 1);
  }
  return;
}

Assistant:

static void
extent_interior_deregister(tsdn_t *tsdn, rtree_ctx_t *rtree_ctx,
    extent_t *extent) {
	size_t i;

	assert(extent_slab_get(extent));

	for (i = 1; i < (extent_size_get(extent) >> LG_PAGE) - 1; i++) {
		rtree_clear(tsdn, &extents_rtree, rtree_ctx,
		    (uintptr_t)extent_base_get(extent) + (uintptr_t)(i <<
		    LG_PAGE));
	}
}